

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

CURLcode Curl_pp_flushsend(Curl_easy *data,pingpong *pp)

{
  connectdata *pcVar1;
  curltime cVar2;
  undefined4 uStack_3c;
  CURLcode result;
  curl_socket_t sock;
  ssize_t written;
  connectdata *conn;
  pingpong *pp_local;
  Curl_easy *data_local;
  
  written = (ssize_t)data->conn;
  conn = (connectdata *)pp;
  pp_local = (pingpong *)data;
  data_local._4_4_ =
       Curl_write(data,((connectdata *)written)->sock[0],
                  pp->sendthis + (pp->sendsize - pp->sendleft),pp->sendleft,(ssize_t *)&result);
  pcVar1 = conn;
  if (data_local._4_4_ == CURLE_OK) {
    if (_result == (conn->chunk).datasize) {
      (conn->bundle_node).next = (Curl_llist_element *)0x0;
      (conn->chunk).state = CHUNK_HEX;
      (conn->chunk).hexindex = '\0';
      (conn->chunk).hexbuffer[0] = '\0';
      (conn->chunk).hexbuffer[1] = '\0';
      (conn->chunk).hexbuffer[2] = '\0';
      (conn->chunk).datasize = 0;
      cVar2 = Curl_now();
      *(time_t *)((pcVar1->chunk).hexbuffer + 3) = cVar2.tv_sec;
      *(ulong *)((pcVar1->chunk).hexbuffer + 0xb) = CONCAT44(uStack_3c,cVar2.tv_usec);
    }
    else {
      (conn->chunk).datasize = (conn->chunk).datasize - _result;
    }
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_pp_flushsend(struct Curl_easy *data,
                           struct pingpong *pp)
{
  /* we have a piece of a command still left to send */
  struct connectdata *conn = data->conn;
  ssize_t written;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  CURLcode result = Curl_write(data, sock, pp->sendthis + pp->sendsize -
                               pp->sendleft, pp->sendleft, &written);
  if(result)
    return result;

  if(written != (ssize_t)pp->sendleft) {
    /* only a fraction was sent */
    pp->sendleft -= written;
  }
  else {
    pp->sendthis = NULL;
    pp->sendleft = pp->sendsize = 0;
    pp->response = Curl_now();
  }
  return CURLE_OK;
}